

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerEquirect2KHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  code *pcVar1;
  void *value_00;
  undefined8 uVar2;
  XrCompositionLayerEquirect2KHR *pXVar3;
  bool bVar4;
  XrInstance pXVar5;
  ostream *poVar6;
  XrSwapchainSubImage *value_01;
  XrPosef *value_02;
  invalid_argument *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40 [36];
  int local_b1c;
  ostringstream local_b18 [8];
  ostringstream oss_lowerVerticalAngle;
  string local_9a0 [8];
  string lowerverticalangle_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980 [36];
  int local_95c;
  ostringstream local_958 [8];
  ostringstream oss_upperVerticalAngle;
  string local_7e0 [8];
  string upperverticalangle_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0 [36];
  int local_79c;
  ostringstream local_798 [8];
  ostringstream oss_centralHorizontalAngle;
  string local_620 [8];
  string centralhorizontalangle_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600 [36];
  int local_5dc;
  ostringstream local_5d8 [8];
  ostringstream oss_radius;
  string local_460 [8];
  string radius_prefix;
  allocator local_439;
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [8];
  string pose_prefix;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [8];
  string subimage_prefix;
  __cxx11 local_370 [32];
  string local_350 [8];
  string eyevisibility_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330 [32];
  ostringstream local_310 [8];
  ostringstream oss_space;
  string local_198 [8];
  string space_prefix;
  __cxx11 local_178 [32];
  string local_158 [8];
  string layerflags_prefix;
  string local_138 [32];
  string local_118 [8];
  string next_prefix;
  __cxx11 local_f8 [32];
  char acStack_d8 [8];
  char type_string_1 [64];
  string local_90 [8];
  string type_prefix;
  undefined1 local_60 [40];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  XrOffset2Di XStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrCompositionLayerEquirect2KHR *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_60._32_8_ = contents;
  contents_local._7_1_ = is_pointer;
  XStack_30 = (XrOffset2Di)type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrCompositionLayerEquirect2KHR *)gen_dispatch_table;
  PointerToHexString<XrCompositionLayerEquirect2KHR>((XrCompositionLayerEquirect2KHR *)local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"type");
  uVar2 = local_60._32_8_;
  if (value_local == (XrCompositionLayerEquirect2KHR *)0x0) {
    std::__cxx11::to_string(local_f8,*(int *)prefix_local);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    type_string_1[0x28] = '\0';
    type_string_1[0x29] = '\0';
    type_string_1[0x2a] = '\0';
    type_string_1[0x2b] = '\0';
    type_string_1[0x2c] = '\0';
    type_string_1[0x2d] = '\0';
    type_string_1[0x2e] = '\0';
    type_string_1[0x2f] = '\0';
    type_string_1[0x30] = '\0';
    type_string_1[0x31] = '\0';
    type_string_1[0x32] = '\0';
    type_string_1[0x33] = '\0';
    type_string_1[0x34] = '\0';
    type_string_1[0x35] = '\0';
    type_string_1[0x36] = '\0';
    type_string_1[0x37] = '\0';
    type_string_1[0x18] = '\0';
    type_string_1[0x19] = '\0';
    type_string_1[0x1a] = '\0';
    type_string_1[0x1b] = '\0';
    type_string_1[0x1c] = '\0';
    type_string_1[0x1d] = '\0';
    type_string_1[0x1e] = '\0';
    type_string_1[0x1f] = '\0';
    type_string_1[0x20] = '\0';
    type_string_1[0x21] = '\0';
    type_string_1[0x22] = '\0';
    type_string_1[0x23] = '\0';
    type_string_1[0x24] = '\0';
    type_string_1[0x25] = '\0';
    type_string_1[0x26] = '\0';
    type_string_1[0x27] = '\0';
    type_string_1[8] = '\0';
    type_string_1[9] = '\0';
    type_string_1[10] = '\0';
    type_string_1[0xb] = '\0';
    type_string_1[0xc] = '\0';
    type_string_1[0xd] = '\0';
    type_string_1[0xe] = '\0';
    type_string_1[0xf] = '\0';
    type_string_1[0x10] = '\0';
    type_string_1[0x11] = '\0';
    type_string_1[0x12] = '\0';
    type_string_1[0x13] = '\0';
    type_string_1[0x14] = '\0';
    type_string_1[0x15] = '\0';
    type_string_1[0x16] = '\0';
    type_string_1[0x17] = '\0';
    acStack_d8[0] = '\0';
    acStack_d8[1] = '\0';
    acStack_d8[2] = '\0';
    acStack_d8[3] = '\0';
    acStack_d8[4] = '\0';
    acStack_d8[5] = '\0';
    acStack_d8[6] = '\0';
    acStack_d8[7] = '\0';
    type_string_1[0] = '\0';
    type_string_1[1] = '\0';
    type_string_1[2] = '\0';
    type_string_1[3] = '\0';
    type_string_1[4] = '\0';
    type_string_1[5] = '\0';
    type_string_1[6] = '\0';
    type_string_1[7] = '\0';
    pcVar1 = *(code **)&(value_local->subImage).imageArrayIndex;
    pXVar5 = FindInstanceFromDispatchTable((XrGeneratedDispatchTable *)value_local);
    (*pcVar1)(pXVar5,*(undefined4 *)prefix_local,acStack_d8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)local_60._32_8_,(char (*) [16])"XrStructureType",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               (char (*) [64])acStack_d8);
  }
  std::__cxx11::string::string(local_118,(string *)prefix);
  std::__cxx11::string::operator+=(local_118,"next");
  pXVar3 = value_local;
  value_00 = *(void **)(prefix_local + 8);
  std::__cxx11::string::string(local_138,local_118);
  bVar4 = ApiDumpDecodeNextChain
                    ((XrGeneratedDispatchTable *)pXVar3,value_00,(string *)local_138,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_138);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string(local_158,(string *)prefix);
  std::__cxx11::string::operator+=(local_158,"layerFlags");
  uVar2 = local_60._32_8_;
  std::__cxx11::to_string(local_178,*(unsigned_long *)(prefix_local + 0x10));
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar2,(char (*) [24])"XrCompositionLayerFlags",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::string(local_198,(string *)prefix);
  std::__cxx11::string::operator+=(local_198,"space");
  std::__cxx11::ostringstream::ostringstream(local_310);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_310,std::hex);
  std::ostream::operator<<(poVar6,*(void **)(prefix_local + 0x18));
  uVar2 = local_60._32_8_;
  std::__cxx11::ostringstream::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar2,(char (*) [8])"XrSpace",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             local_330);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::string(local_350,(string *)prefix);
  std::__cxx11::string::operator+=(local_350,"eyeVisibility");
  uVar2 = local_60._32_8_;
  std::__cxx11::to_string(local_370,*(int *)(prefix_local + 0x20));
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)uVar2,(char (*) [16])"XrEyeVisibility",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370);
  std::__cxx11::string::~string((string *)local_370);
  std::__cxx11::string::string(local_390,(string *)prefix);
  std::__cxx11::string::operator+=(local_390,"subImage");
  pXVar3 = value_local;
  value_01 = (XrSwapchainSubImage *)(prefix_local + 0x28);
  std::__cxx11::string::string(local_3b0,local_390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"XrSwapchainSubImage",&local_3d1);
  bVar4 = ApiDumpOutputXrStruct
                    ((XrGeneratedDispatchTable *)pXVar3,value_01,(string *)local_3b0,
                     (string *)local_3d0,false,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string(local_3b0);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string(local_3f8,(string *)prefix);
  std::__cxx11::string::operator+=(local_3f8,"pose");
  pXVar3 = value_local;
  value_02 = (XrPosef *)(prefix_local + 0x48);
  std::__cxx11::string::string(local_418,local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"XrPosef",&local_439);
  bVar4 = ApiDumpOutputXrStruct
                    ((XrGeneratedDispatchTable *)pXVar3,value_02,(string *)local_418,
                     (string *)local_438,false,
                     (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_60._32_8_);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_418);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_460,(string *)prefix);
    std::__cxx11::string::operator+=(local_460,"radius");
    std::__cxx11::ostringstream::ostringstream(local_5d8);
    local_5dc = (int)std::setprecision(0x20);
    poVar6 = std::operator<<((ostream *)local_5d8,(_Setprecision)local_5dc);
    std::ostream::operator<<(poVar6,*(float *)(prefix_local + 100));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [6])"float",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
               local_600);
    std::__cxx11::string::~string((string *)local_600);
    std::__cxx11::string::string(local_620,(string *)prefix);
    std::__cxx11::string::operator+=(local_620,"centralHorizontalAngle");
    std::__cxx11::ostringstream::ostringstream(local_798);
    local_79c = (int)std::setprecision(0x20);
    poVar6 = std::operator<<((ostream *)local_798,(_Setprecision)local_79c);
    std::ostream::operator<<(poVar6,*(float *)(prefix_local + 0x68));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [6])"float",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
               local_7c0);
    std::__cxx11::string::~string((string *)local_7c0);
    std::__cxx11::string::string(local_7e0,(string *)prefix);
    std::__cxx11::string::operator+=(local_7e0,"upperVerticalAngle");
    std::__cxx11::ostringstream::ostringstream(local_958);
    local_95c = (int)std::setprecision(0x20);
    poVar6 = std::operator<<((ostream *)local_958,(_Setprecision)local_95c);
    std::ostream::operator<<(poVar6,*(float *)(prefix_local + 0x6c));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [6])"float",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e0,
               local_980);
    std::__cxx11::string::~string((string *)local_980);
    std::__cxx11::string::string(local_9a0,(string *)prefix);
    std::__cxx11::string::operator+=(local_9a0,"lowerVerticalAngle");
    std::__cxx11::ostringstream::ostringstream(local_b18);
    local_b1c = (int)std::setprecision(0x20);
    poVar6 = std::operator<<((ostream *)local_b18,(_Setprecision)local_b1c);
    std::ostream::operator<<(poVar6,*(float *)(prefix_local + 0x70));
    uVar2 = local_60._32_8_;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)uVar2,(char (*) [6])"float",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a0,
               local_b40);
    std::__cxx11::string::~string((string *)local_b40);
    gen_dispatch_table_local._7_1_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_b18);
    std::__cxx11::string::~string(local_9a0);
    std::__cxx11::ostringstream::~ostringstream(local_958);
    std::__cxx11::string::~string(local_7e0);
    std::__cxx11::ostringstream::~ostringstream(local_798);
    std::__cxx11::string::~string(local_620);
    std::__cxx11::ostringstream::~ostringstream(local_5d8);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string(local_3f8);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::ostringstream::~ostringstream(local_310);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_90);
    return (bool)(gen_dispatch_table_local._7_1_ & 1);
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar7,"Invalid Operation");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerEquirect2KHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string layerflags_prefix = prefix;
        layerflags_prefix += "layerFlags";
        contents.emplace_back("XrCompositionLayerFlags", layerflags_prefix, std::to_string(value->layerFlags));
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string eyevisibility_prefix = prefix;
        eyevisibility_prefix += "eyeVisibility";
        contents.emplace_back("XrEyeVisibility", eyevisibility_prefix, std::to_string(value->eyeVisibility));
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        std::string centralhorizontalangle_prefix = prefix;
        centralhorizontalangle_prefix += "centralHorizontalAngle";
        std::ostringstream oss_centralHorizontalAngle;
        oss_centralHorizontalAngle << std::setprecision(32) << (value->centralHorizontalAngle);
        contents.emplace_back("float", centralhorizontalangle_prefix, oss_centralHorizontalAngle.str());
        std::string upperverticalangle_prefix = prefix;
        upperverticalangle_prefix += "upperVerticalAngle";
        std::ostringstream oss_upperVerticalAngle;
        oss_upperVerticalAngle << std::setprecision(32) << (value->upperVerticalAngle);
        contents.emplace_back("float", upperverticalangle_prefix, oss_upperVerticalAngle.str());
        std::string lowerverticalangle_prefix = prefix;
        lowerverticalangle_prefix += "lowerVerticalAngle";
        std::ostringstream oss_lowerVerticalAngle;
        oss_lowerVerticalAngle << std::setprecision(32) << (value->lowerVerticalAngle);
        contents.emplace_back("float", lowerverticalangle_prefix, oss_lowerVerticalAngle.str());
        return true;
    } catch(...) {
    }
    return false;
}